

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::removeClause(Solver *this,CRef cr,bool remove_from_proof)

{
  anon_struct_8_10_eb538618_for_header *paVar1;
  uint64_t *puVar2;
  lbool *plVar3;
  VarData *pVVar4;
  OnlineProofChecker *this_00;
  FILE *__stream;
  uchar *puVar5;
  byte *pbVar6;
  bool bVar7;
  undefined8 in_RAX;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  undefined7 in_register_00000011;
  anon_struct_8_10_eb538618_for_header *paVar11;
  anon_struct_8_10_eb538618_for_header *cls;
  undefined8 uStack_38;
  
  cls = (anon_struct_8_10_eb538618_for_header *)
        ((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
  puVar2 = &(this->statistics).solveSteps;
  *puVar2 = *puVar2 + 1;
  uStack_38 = in_RAX;
  detachClause(this,cr,false);
  if ((int)CONCAT71(in_register_00000011,remove_from_proof) != 0) {
    if (SUB84(*cls,4) >> 2 == 2) {
      uVar8 = (ulong)((this->assigns).data[*(int *)(cls + 1) >> 1].value !=
                     ((byte)*(int *)(cls + 1) & 1));
    }
    else {
      uVar8 = 0;
    }
    paVar1 = cls + 1;
    iVar9 = *(int *)(&cls[1].field_0x0 + uVar8 * 4) >> 1;
    plVar3 = (this->assigns).data;
    if (((plVar3[iVar9].value == ((byte)*(int *)(&cls[1].field_0x0 + uVar8 * 4) & 1)) &&
        (uVar8 = (ulong)(this->vardata).data[iVar9].reason, uVar8 != 0xffffffff)) &&
       ((anon_struct_8_10_eb538618_for_header *)
        ((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar8) == cls)) {
      paVar11 = paVar1;
      if ((((ulong)*cls & 0xfffffffc00000000) == 0x800000000) &&
         (paVar11 = (anon_struct_8_10_eb538618_for_header *)&cls[1].field_0x4,
         plVar3[*(int *)(cls + 1) >> 1].value == ((byte)*(int *)(cls + 1) & 1))) {
        paVar11 = paVar1;
      }
      uVar10 = *(uint *)paVar11;
      iVar9 = (int)uVar10 >> 1;
      pVVar4 = (this->vardata).data;
      pVVar4[iVar9].reason = 0xffffffff;
      if (((this->drup_file != (FILE *)0x0) &&
          (this_00 = this->onlineDratChecker, this_00 != (OnlineProofChecker *)0x0)) &&
         (pVVar4[iVar9].level == 0)) {
        uVar10 = (uint)(plVar3[iVar9].value == '\x01') | uVar10 & 0xfffffffe;
        uStack_38 = CONCAT44(uVar10,(undefined4)uStack_38);
        if ((this_00->tmpLits).data != (Lit *)0x0) {
          (this_00->tmpLits).sz = 0;
        }
        if (uVar10 != 0xfffffffe) {
          vec<Minisat::Lit>::push(&this_00->tmpLits,(Lit *)((long)&uStack_38 + 4));
        }
        bVar7 = OnlineProofChecker::addClause(this_00,&this_00->tmpLits,false);
        if (!bVar7) goto LAB_001154e8;
      }
    }
    __stream = (FILE *)this->drup_file;
    if (__stream != (FILE *)0x0) {
      if (((ulong)*cls & 3) == 1) {
        if (0 < this->verbosity) {
          puts("c Bug. I don\'t expect this to happen.");
        }
      }
      else {
        puVar5 = this->buf_ptr;
        this->buf_ptr = puVar5 + 1;
        *puVar5 = 'd';
        this->buf_len = this->buf_len + 1;
        if (this->onlineDratChecker != (OnlineProofChecker *)0x0) {
          bVar7 = OnlineProofChecker::removeClause<Minisat::Clause>
                            (this->onlineDratChecker,(Clause *)cls);
          if (!bVar7) {
LAB_001154e8:
            exit(0x86);
          }
        }
        if ((ulong)*cls >> 0x22 != 0) {
          uVar8 = 0;
          do {
            uVar10 = *(uint *)((long)&paVar1->field_0x0 + uVar8 * 4) + 2;
            do {
              pbVar6 = this->buf_ptr;
              this->buf_ptr = pbVar6 + 1;
              *pbVar6 = (byte)uVar10 | 0x80;
              this->buf_len = this->buf_len + 1;
              bVar7 = 0x7f < uVar10;
              uVar10 = uVar10 >> 7;
            } while (bVar7);
            this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)*cls >> 0x22);
        }
        puVar5 = this->buf_ptr;
        this->buf_ptr = puVar5 + 1;
        *puVar5 = '\0';
        iVar9 = this->buf_len;
        uVar10 = iVar9 + 1;
        this->buf_len = uVar10;
        if (0xfffff < iVar9) {
          fwrite_unlocked(drup_buf,1,(ulong)uVar10,__stream);
          this->buf_ptr = drup_buf;
          this->buf_len = 0;
        }
      }
    }
  }
  *cls = (anon_struct_8_10_eb538618_for_header)(((ulong)*cls & 0xfffffffffffffffc) + 1);
  uVar8 = *(ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
  uVar10 = 2;
  if ((uVar8 & 4) == 0) {
    uVar10 = (uint)(uVar8 >> 3) & 1;
  }
  (this->ca).super_RegionAllocator<unsigned_int>.wasted_ =
       (uint)(uVar8 >> 0x22) + (this->ca).super_RegionAllocator<unsigned_int>.wasted_ + uVar10 + 2;
  return;
}

Assistant:

void Solver::removeClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];
    statistics.solveSteps++;

    detachClause(cr);
    // Don't leave pointers to free'd memory!
    if (remove_from_proof) {
        if (locked(c)) {
            Lit implied = c.size() != 2 ? c[0] : (value(c[0]) == l_True ? c[0] : c[1]);
            vardata[var(implied)].reason = CRef_Undef;
            if (drup_file && onlineDratChecker && level(var(implied)) == 0) { /* before we drop the reason, store a unit */
                if (!onlineDratChecker->addClause(mkLit(var(implied), value(var(implied)) == l_False))) exit(134);
            }
        }
        if (drup_file) {
            if (c.mark() != 1) {
#ifdef BIN_DRUP
                binDRUP('d', c, drup_file);
#else
                fprintf(drup_file, "d ");
                for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            } else if (verbosity >= 1) {
                printf("c Bug. I don't expect this to happen.\n");
            }
        }
    }

    c.mark(1);
    ca.free(cr);
}